

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_20b6e07::ComputeFlowTest::RunCheckOutput(ComputeFlowTest *this,int run_times)

{
  ACMRandom *this_00;
  undefined8 *puVar1;
  __suseconds_t _Var2;
  ComputeFlowTest *pCVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  aom_image_t *paVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int x;
  SEARCH_METHODS *pSVar10;
  int y;
  double dVar11;
  AssertHelper local_130;
  undefined8 *local_128;
  AssertHelper local_120;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_118;
  uint8_t *ref;
  uint8_t *src;
  aom_usec_timer ref_timer;
  double v_test;
  double u_test;
  aom_usec_timer test_timer;
  double v_ref;
  double u_ref;
  double local_a0;
  ComputeFlowTest *local_98;
  YUVVideoSource video;
  
  ref_timer.begin.tv_sec = (__time_t)&ref_timer.end;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&ref_timer,"bus_352x288_420_f20_b8.yuv","");
  libaom_test::YUVVideoSource::YUVVideoSource
            (&video,(string *)&ref_timer,AOM_IMG_FMT_I420,0x160,0x120,0x1e,1,0,2);
  if ((timeval *)ref_timer.begin.tv_sec != &ref_timer.end) {
    operator_delete((void *)ref_timer.begin.tv_sec);
  }
  libaom_test::YUVVideoSource::Begin(&video);
  paVar6 = video.img_;
  if (video.limit_ <= video.frame_) {
    paVar6 = (aom_image_t *)0x0;
  }
  src = paVar6->planes[0];
  test_timer.begin.tv_sec = 0;
  testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
            ((internal *)&ref_timer,"src","nullptr",&src,(void **)&test_timer);
  _Var2 = ref_timer.begin.tv_usec;
  if ((char)ref_timer.begin.tv_sec == '\0') {
    testing::Message::Message((Message *)&test_timer);
    if (ref_timer.begin.tv_usec == 0) {
      pSVar10 = "";
    }
    else {
      pSVar10 = *(SEARCH_METHODS **)ref_timer.begin.tv_usec;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/disflow_test.cc"
               ,0x35,(char *)pSVar10);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&test_timer);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if (test_timer.begin.tv_sec != 0) {
      (**(code **)(*(long *)test_timer.begin.tv_sec + 8))();
    }
    if (ref_timer.begin.tv_usec == 0) goto LAB_007175d8;
    if (*(void **)ref_timer.begin.tv_usec != (void *)(ref_timer.begin.tv_usec + 0x10)) {
      operator_delete(*(void **)ref_timer.begin.tv_usec);
    }
  }
  else {
    if (ref_timer.begin.tv_usec != 0) {
      if (*(void **)ref_timer.begin.tv_usec != (void *)(ref_timer.begin.tv_usec + 0x10)) {
        operator_delete(*(void **)ref_timer.begin.tv_usec);
      }
      operator_delete((void *)_Var2);
    }
    video.frame_ = video.frame_ + 1;
    (*video.super_VideoSource._vptr_VideoSource[0xb])();
    if (video.limit_ <= video.frame_) {
      video.img_ = (aom_image_t *)0x0;
    }
    ref = (video.img_)->planes[0];
    test_timer.begin.tv_sec = 0;
    testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
              ((internal *)&ref_timer,"ref","nullptr",&ref,(void **)&test_timer);
    _Var2 = ref_timer.begin.tv_usec;
    if ((char)ref_timer.begin.tv_sec == '\0') {
      testing::Message::Message((Message *)&test_timer);
      if (ref_timer.begin.tv_usec == 0) {
        pSVar10 = "";
      }
      else {
        pSVar10 = *(SEARCH_METHODS **)ref_timer.begin.tv_usec;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/disflow_test.cc"
                 ,0x38,(char *)pSVar10);
      testing::internal::AssertHelper::operator=(&local_130,(Message *)&test_timer);
      testing::internal::AssertHelper::~AssertHelper(&local_130);
      if (test_timer.begin.tv_sec != 0) {
        (**(code **)(*(long *)test_timer.begin.tv_sec + 8))();
      }
      if (ref_timer.begin.tv_usec == 0) goto LAB_007175d8;
      if (*(void **)ref_timer.begin.tv_usec != (void *)(ref_timer.begin.tv_usec + 0x10)) {
        operator_delete(*(void **)ref_timer.begin.tv_usec);
      }
    }
    else {
      if (ref_timer.begin.tv_usec != 0) {
        if (*(void **)ref_timer.begin.tv_usec != (void *)(ref_timer.begin.tv_usec + 0x10)) {
          operator_delete(*(void **)ref_timer.begin.tv_usec);
        }
        operator_delete((void *)_Var2);
      }
      this_00 = &this->rnd_;
      uVar4 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
      u_test = ((double)(uVar4 >> 0x17 & 0xff) / 255.0) * 10.0 + -5.0;
      u_ref = u_test;
      uVar4 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
      v_test = ((double)(uVar4 >> 0x17 & 0xff) / 255.0) * 10.0 + -5.0;
      v_ref = v_test;
      uVar4 = testing::internal::Random::Generate(&this_00->random_,0x151);
      uVar5 = testing::internal::Random::Generate(&this_00->random_,0x111);
      x = uVar4 + 8;
      y = uVar5 + 8;
      aom_compute_flow_at_point_c(src,ref,x,y,0x160,0x120,0x160,&u_ref,&v_ref);
      (*this->target_func_)(src,ref,x,y,0x160,0x120,0x160,&u_test,&v_test);
      if (1 < run_times) {
        local_98 = this;
        gettimeofday((timeval *)&ref_timer,(__timezone_ptr_t)0x0);
        iVar9 = run_times;
        do {
          aom_compute_flow_at_point_c(src,ref,x,y,0x160,0x120,0x160,&u_ref,&v_ref);
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
        gettimeofday((timeval *)&ref_timer.end,(__timezone_ptr_t)0x0);
        lVar7 = ref_timer.end.tv_usec - ref_timer.begin.tv_usec;
        lVar8 = lVar7 + 1000000;
        if (-1 < lVar7) {
          lVar8 = lVar7;
        }
        local_a0 = (double)(((lVar7 >> 0x3f) + (ref_timer.end.tv_sec - ref_timer.begin.tv_sec)) *
                            1000000 + lVar8);
        gettimeofday((timeval *)&test_timer,(__timezone_ptr_t)0x0);
        pCVar3 = local_98;
        do {
          (*pCVar3->target_func_)(src,ref,x,y,0x160,0x120,0x160,&u_test,&v_test);
          run_times = run_times + -1;
        } while (run_times != 0);
        gettimeofday((timeval *)&test_timer.end,(__timezone_ptr_t)0x0);
        lVar7 = test_timer.end.tv_usec - test_timer.begin.tv_usec;
        lVar8 = lVar7 + 1000000;
        if (-1 < lVar7) {
          lVar8 = lVar7;
        }
        dVar11 = (double)(((lVar7 >> 0x3f) + (test_timer.end.tv_sec - test_timer.begin.tv_sec)) *
                          1000000 + lVar8);
        printf("c_time=%fns \t simd_time=%fns \t speedup=%.2f\n",local_a0,dVar11,local_a0 / dVar11);
        goto LAB_007175d8;
      }
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)&local_130,"u_ref","u_test",&u_ref,&u_test);
      puVar1 = local_128;
      if (local_130.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_118);
        if (local_128 == (undefined8 *)0x0) {
          pSVar10 = "";
        }
        else {
          pSVar10 = (SEARCH_METHODS *)*local_128;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_120,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/disflow_test.cc"
                   ,0x67,(char *)pSVar10);
        testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_118);
        testing::internal::AssertHelper::~AssertHelper(&local_120);
        if (local_118._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_118._M_head_impl + 8))();
        }
        if (local_128 == (undefined8 *)0x0) goto LAB_007175d8;
        ref_timer.begin.tv_usec = (__suseconds_t)local_128;
        if ((undefined8 *)*local_128 != local_128 + 2) {
          operator_delete((undefined8 *)*local_128);
        }
      }
      else {
        if (local_128 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_128 != local_128 + 2) {
            operator_delete((undefined8 *)*local_128);
          }
          operator_delete(puVar1);
        }
        testing::internal::CmpHelperEQ<double,double>
                  ((internal *)&local_130,"v_ref","v_test",&v_ref,&v_test);
        if (local_130.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_118);
          if (local_128 == (undefined8 *)0x0) {
            pSVar10 = "";
          }
          else {
            pSVar10 = (SEARCH_METHODS *)*local_128;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_120,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/disflow_test.cc"
                     ,0x68,(char *)pSVar10);
          testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_118);
          testing::internal::AssertHelper::~AssertHelper(&local_120);
          if (local_118._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_118._M_head_impl + 8))();
          }
          if (local_128 == (undefined8 *)0x0) goto LAB_007175d8;
          ref_timer.begin.tv_usec = (__suseconds_t)local_128;
          if ((undefined8 *)*local_128 != local_128 + 2) {
            operator_delete((undefined8 *)*local_128);
          }
        }
        else {
          if (local_128 == (undefined8 *)0x0) goto LAB_007175d8;
          ref_timer.begin.tv_usec = (__suseconds_t)local_128;
          if ((undefined8 *)*local_128 != local_128 + 2) {
            operator_delete((undefined8 *)*local_128);
          }
        }
      }
    }
  }
  operator_delete((void *)ref_timer.begin.tv_usec);
LAB_007175d8:
  libaom_test::YUVVideoSource::~YUVVideoSource(&video);
  return;
}

Assistant:

void ComputeFlowTest::RunCheckOutput(int run_times) {
  constexpr int kWidth = 352;
  constexpr int kHeight = 288;

  ::libaom_test::YUVVideoSource video("bus_352x288_420_f20_b8.yuv",
                                      AOM_IMG_FMT_I420, kWidth, kHeight, 30, 1,
                                      0, 2);
  // Use Y (Luminance) plane.
  video.Begin();
  uint8_t *src = video.img()->planes[0];
  ASSERT_NE(src, nullptr);
  video.Next();
  uint8_t *ref = video.img()->planes[0];
  ASSERT_NE(ref, nullptr);

  // Pick a random value between -5 and 5. The range was chosen arbitrarily as
  // u and v can take any kind of value in practise, but it shouldn't change the
  // outcome of the tests.
  const double u_rand = (static_cast<double>(rnd_.Rand8()) / 255) * 10 - 5;
  double u_ref = u_rand;
  double u_test = u_rand;

  const double v_rand = (static_cast<double>(rnd_.Rand8()) / 255) * 10 - 5;
  double v_ref = v_rand;
  double v_test = v_rand;

  // Pick a random point in the frame. If the frame is 352x288, that means we
  // can call the function on all values of x comprised between 8 and 344, and
  // all values of y comprised between 8 and 280.
  const int x = rnd_((kWidth - 8) - 8 + 1) + 8;
  const int y = rnd_((kHeight - 8) - 8 + 1) + 8;

  aom_usec_timer ref_timer, test_timer;

  aom_compute_flow_at_point_c(src, ref, x, y, kWidth, kHeight, kWidth, &u_ref,
                              &v_ref);

  target_func_(src, ref, x, y, kWidth, kHeight, kWidth, &u_test, &v_test);

  if (run_times > 1) {
    aom_usec_timer_start(&ref_timer);
    for (int i = 0; i < run_times; ++i) {
      aom_compute_flow_at_point_c(src, ref, x, y, kWidth, kHeight, kWidth,
                                  &u_ref, &v_ref);
    }
    aom_usec_timer_mark(&ref_timer);
    const double elapsed_time_c =
        static_cast<double>(aom_usec_timer_elapsed(&ref_timer));

    aom_usec_timer_start(&test_timer);
    for (int i = 0; i < run_times; ++i) {
      target_func_(src, ref, x, y, kWidth, kHeight, kWidth, &u_test, &v_test);
    }
    aom_usec_timer_mark(&test_timer);
    const double elapsed_time_simd =
        static_cast<double>(aom_usec_timer_elapsed(&test_timer));

    printf("c_time=%fns \t simd_time=%fns \t speedup=%.2f\n", elapsed_time_c,
           elapsed_time_simd, (elapsed_time_c / elapsed_time_simd));
  } else {
    ASSERT_EQ(u_ref, u_test);
    ASSERT_EQ(v_ref, v_test);
  }
}